

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O0

void cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(string *presetName,cmJSONState *state)

{
  string local_38;
  cmJSONState *local_18;
  cmJSONState *state_local;
  string *presetName_local;
  
  local_18 = state;
  state_local = (cmJSONState *)presetName;
  cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[2]>
            (&local_38,(char (*) [29])"Invalid macro expansion in \"",presetName,
             (char (*) [2])0x12790e2);
  cmJSONState::AddError(state,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void INVALID_MACRO_EXPANSION(const std::string& presetName, cmJSONState* state)
{
  state->AddError(cmStrCat("Invalid macro expansion in \"", presetName, "\""));
}